

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peerman_args.cpp
# Opt level: O3

void node::ApplyArgsManOptions(ArgsManager *argsman,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  optional<bool> oVar2;
  _Storage<long,_true> _Var3;
  uint32_t uVar4;
  _Storage<long,_true> _Var5;
  long in_FS_OFFSET;
  optional<long> oVar6;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-txreconciliation","");
  oVar2 = ArgsManager::GetBoolArg(argsman,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (((ushort)oVar2.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->reconcile_txs =
         oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-maxorphantx","");
  oVar6 = ArgsManager::GetIntArg(argsman,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])
       oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    _Var3._M_value = 0xffffffff;
    if (oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload < 0xffffffff) {
      _Var3._M_value =
           oVar6.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    _Var5._M_value = 0;
    if (0 < _Var3._M_value) {
      _Var5 = _Var3;
    }
    options->max_orphan_txs = (uint32_t)_Var5._M_value;
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"-blockreconstructionextratxn","");
  oVar6 = ArgsManager::GetIntArg(argsman,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])
       oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    _Var3._M_value = 0xffffffff;
    if (oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload < 0xffffffff) {
      _Var3._M_value =
           oVar6.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    uVar4 = 0;
    if (0 < _Var3._M_value) {
      uVar4 = (uint32_t)_Var3._M_value;
    }
    options->max_extra_txs = uVar4;
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-capturemessages","");
  oVar2 = ArgsManager::GetBoolArg(argsman,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (((ushort)oVar2.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->capture_messages =
         oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-blocksonly","");
  oVar2 = ArgsManager::GetBoolArg(argsman,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (((ushort)oVar2.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->ignore_incoming_txs =
         oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ApplyArgsManOptions(const ArgsManager& argsman, PeerManager::Options& options)
{
    if (auto value{argsman.GetBoolArg("-txreconciliation")}) options.reconcile_txs = *value;

    if (auto value{argsman.GetIntArg("-maxorphantx")}) {
        options.max_orphan_txs = uint32_t((std::clamp<int64_t>(*value, 0, std::numeric_limits<uint32_t>::max())));
    }

    if (auto value{argsman.GetIntArg("-blockreconstructionextratxn")}) {
        options.max_extra_txs = uint32_t((std::clamp<int64_t>(*value, 0, std::numeric_limits<uint32_t>::max())));
    }

    if (auto value{argsman.GetBoolArg("-capturemessages")}) options.capture_messages = *value;

    if (auto value{argsman.GetBoolArg("-blocksonly")}) options.ignore_incoming_txs = *value;
}